

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::TParseContext::declareBlock
          (TParseContext *this,TSourceLoc *loc,TTypeList *typeList,TString *instanceName,
          TArraySizes *arraySizes)

{
  undefined8 uVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  size_type sVar6;
  reference pvVar7;
  undefined4 extraout_var;
  TSourceLoc *pTVar8;
  undefined4 extraout_var_00;
  char *pcVar9;
  undefined4 extraout_var_01;
  TSpirvDecorate *pTVar10;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  ulong uVar11;
  reference pvVar12;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  TSymbol *pTVar13;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  TType *pTVar14;
  TTypeList *pTVar15;
  undefined4 extraout_var_13;
  vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_> *this_00;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  TQualifier *pTVar16;
  TVariable *pTVar17;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  long lVar18;
  char *pcVar19;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  size_t sVar20;
  TString *local_3e0;
  TVariable *local_320;
  TVariable *local_318;
  TVariable *variable;
  TSymbol *existingName_1;
  TVariable *blockNameVar_1;
  TType blockNameType_1;
  TSymbol *existingName;
  TVariable *blockNameVar;
  TType blockNameType;
  TType blockType;
  uint member_4;
  uint member_3;
  TQualifier newMemberQualification;
  char *feature;
  TSourceLoc *memberLoc_1;
  TQualifier *memberQualifier_1;
  uint member_2;
  bool memberWithPerViewQualifier;
  bool memberWithoutLocation;
  bool memberWithLocation;
  TQualifier defaultQualification;
  uint member_1;
  TSourceLoc *memberLoc;
  TQualifier *memberQualifier;
  TType *memberType;
  uint member;
  TArraySizes *arraySizes_local;
  TString *instanceName_local;
  TTypeList *typeList_local;
  TSourceLoc *loc_local;
  TParseContext *this_local;
  
  if ((0 < (this->super_TParseContextBase).super_TParseVersions.spvVersion.vulkan) &&
     (((this->super_TParseContextBase).super_TParseVersions.spvVersion.vulkanRelaxed & 1U) != 0)) {
    blockStorageRemap(this,loc,this->blockName,&this->currentBlockQualifier);
  }
  blockStageIoCheck(this,loc,&this->currentBlockQualifier);
  blockQualifierCheck(this,loc,&this->currentBlockQualifier,instanceName != (TString *)0x0);
  if (arraySizes != (TArraySizes *)0x0) {
    arraySizesCheck(this,loc,&this->currentBlockQualifier,arraySizes,(TIntermTyped *)0x0,false);
    arrayOfArrayVersionCheck(this,loc,arraySizes);
    iVar4 = TArraySizes::getNumDims(arraySizes);
    if (1 < iVar4) {
      TParseVersions::requireProfile((TParseVersions *)this,loc,-9,"array-of-array of block");
    }
  }
  for (memberType._4_4_ = 0;
      sVar6 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::size
                        (&typeList->
                          super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                        ), memberType._4_4_ < sVar6; memberType._4_4_ = memberType._4_4_ + 1) {
    pvVar7 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::operator[]
                       (&typeList->
                         super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                        ,(ulong)memberType._4_4_);
    pTVar14 = pvVar7->type;
    iVar4 = (*pTVar14->_vptr_TType[10])();
    pTVar16 = (TQualifier *)CONCAT44(extraout_var,iVar4);
    pvVar7 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::operator[]
                       (&typeList->
                         super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                        ,(ulong)memberType._4_4_);
    pTVar8 = &pvVar7->loc;
    if ((((*(ulong *)&pTVar16->field_0x8 & 0x7f) != 0) &&
        (((uint)*(undefined8 *)&pTVar16->field_0x8 & 0x7f) != 1)) &&
       (((uint)*(undefined8 *)&pTVar16->field_0x8 & 0x7f) !=
        ((uint)*(undefined8 *)&(this->currentBlockQualifier).field_0x8 & 0x7f))) {
      iVar4 = (*pTVar14->_vptr_TType[6])();
      pcVar9 = std::__cxx11::
               basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                         ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                           *)CONCAT44(extraout_var_00,iVar4));
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,pTVar8,"member storage qualifier cannot contradict block storage qualifier",
                 pcVar9,"");
    }
    *(ulong *)&pTVar16->field_0x8 =
         *(ulong *)&pTVar16->field_0x8 & 0xffffffffffffff80 |
         (ulong)((uint)*(undefined8 *)&(this->currentBlockQualifier).field_0x8 & 0x7f);
    globalQualifierFixCheck(this,pTVar8,pTVar16,false,(TPublicType *)0x0);
    inheritMemoryQualifiers(this,&this->currentBlockQualifier,pTVar16);
    if ((*(ulong *)&(this->currentBlockQualifier).field_0x8 >> 0x29 & 1) != 0) {
      *(ulong *)&pTVar16->field_0x8 =
           *(ulong *)&pTVar16->field_0x8 & 0xfffffdffffffffff |
           (ulong)((byte)(*(ulong *)&(this->currentBlockQualifier).field_0x8 >> 0x29) & 1) << 0x29;
    }
    if ((*(ulong *)&(this->currentBlockQualifier).field_0x8 >> 0x2a & 1) != 0) {
      *(ulong *)&pTVar16->field_0x8 =
           *(ulong *)&pTVar16->field_0x8 & 0xfffffbffffffffff |
           (ulong)((byte)(*(ulong *)&(this->currentBlockQualifier).field_0x8 >> 0x2a) & 1) << 0x2a;
    }
    if ((*(ulong *)&(this->currentBlockQualifier).field_0x8 >> 0x2b & 1) != 0) {
      *(ulong *)&pTVar16->field_0x8 =
           *(ulong *)&pTVar16->field_0x8 & 0xfffff7ffffffffff |
           (ulong)((byte)(*(ulong *)&(this->currentBlockQualifier).field_0x8 >> 0x2b) & 1) << 0x2b;
    }
    if (((uint)*(undefined8 *)&(this->currentBlockQualifier).field_0x8 & 0x7f) == 0xf) {
      *(ulong *)&pTVar16->field_0x8 = *(ulong *)&pTVar16->field_0x8 & 0xffffffffffffff80 | 0xf;
    }
    if (((uint)*(undefined8 *)&pTVar16->field_0x8 & 0x7f) == 8) {
      iVar4 = (*pTVar14->_vptr_TType[6])();
      pcVar9 = std::__cxx11::
               basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                         ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                           *)CONCAT44(extraout_var_01,iVar4));
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,pTVar8,"member cannot have a spirv_storage_class qualifier",pcVar9);
    }
    bVar2 = TQualifier::hasSpirvDecorate(pTVar16);
    if (bVar2) {
      pTVar10 = TQualifier::getSpirvDecorate(pTVar16);
      bVar2 = std::
              map<int,_glslang::TVector<const_glslang::TIntermTyped_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermTyped_*>_>_>_>
              ::empty(&(pTVar10->decorateIds).
                       super_map<int,_glslang::TVector<const_glslang::TIntermTyped_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermTyped_*>_>_>_>
                     );
      if (!bVar2) {
        iVar4 = (*pTVar14->_vptr_TType[6])();
        pcVar9 = std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                           ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                             *)CONCAT44(extraout_var_02,iVar4));
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,pTVar8,"member cannot have a spirv_decorate_id qualifier",pcVar9);
      }
    }
    if (((((uint)*(undefined8 *)&(this->currentBlockQualifier).field_0x8 & 0x7f) == 5) ||
        (((uint)*(undefined8 *)&(this->currentBlockQualifier).field_0x8 & 0x7f) == 6)) &&
       ((bVar2 = TQualifier::isInterpolation(pTVar16), bVar2 ||
        (bVar2 = TQualifier::isAuxiliary(pTVar16), bVar2)))) {
      iVar4 = (*pTVar14->_vptr_TType[6])();
      pcVar9 = std::__cxx11::
               basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                         ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                           *)CONCAT44(extraout_var_03,iVar4));
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,pTVar8,
                 "member of uniform or buffer block cannot have an auxiliary or interpolation qualifier"
                 ,pcVar9);
    }
    uVar5 = (*pTVar14->_vptr_TType[0x1d])();
    if ((uVar5 & 1) != 0) {
      iVar4 = (*pTVar14->_vptr_TType[0x14])();
      sVar6 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::size
                        (&typeList->
                          super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                        );
      arraySizesCheck(this,pTVar8,&this->currentBlockQualifier,
                      (TArraySizes *)CONCAT44(extraout_var_04,iVar4),(TIntermTyped *)0x0,
                      (ulong)memberType._4_4_ == sVar6 - 1);
    }
    bVar2 = TQualifier::hasOffset(pTVar16);
    if ((bVar2) && ((this->super_TParseContextBase).super_TParseVersions.spvVersion.spv == 0)) {
      TParseVersions::profileRequires
                ((TParseVersions *)this,pTVar8,-9,0x1b8,"GL_ARB_enhanced_layouts",
                 "\"offset\" on block member");
      TParseVersions::profileRequires
                ((TParseVersions *)this,pTVar8,8,300,"GL_ARB_enhanced_layouts",
                 "\"offset\" on block member");
    }
    uVar5 = (*pTVar14->_vptr_TType[0x36])();
    if ((uVar5 & 1) != 0) {
      uVar5 = (*pTVar14->_vptr_TType[0x37])();
      if (((uVar5 & 1) == 0) ||
         (uVar5 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[8])
                            (this,"GL_ARB_bindless_texture"), (uVar5 & 1) == 0)) {
        pvVar7 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
                 operator[](&typeList->
                             super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                            ,(ulong)memberType._4_4_);
        iVar4 = (*pvVar7->type->_vptr_TType[6])();
        pcVar9 = std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                           ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                             *)CONCAT44(extraout_var_05,iVar4));
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,pTVar8,
                   "member of block cannot be or contain a sampler, image, or atomic_uint type",
                   pcVar9);
      }
      else {
        updateBindlessQualifier(this,pTVar14);
      }
    }
    bVar2 = TType::containsCoopMat(pTVar14);
    if (bVar2) {
      pvVar7 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
               operator[](&typeList->
                           super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                          ,(ulong)memberType._4_4_);
      iVar4 = (*pvVar7->type->_vptr_TType[6])();
      pcVar9 = std::__cxx11::
               basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                         ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                           *)CONCAT44(extraout_var_06,iVar4));
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,pTVar8,"member of block cannot be or contain a cooperative matrix type",pcVar9
                );
    }
    bVar2 = TType::containsCoopVec(pTVar14);
    if (bVar2) {
      pvVar7 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
               operator[](&typeList->
                           super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                          ,(ulong)memberType._4_4_);
      iVar4 = (*pvVar7->type->_vptr_TType[6])();
      pcVar9 = std::__cxx11::
               basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                         ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                           *)CONCAT44(extraout_var_07,iVar4));
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,pTVar8,"member of block cannot be or contain a cooperative vector type",pcVar9
                );
    }
  }
  bVar2 = TSymbolTable::atBuiltInLevel((this->super_TParseContextBase).symbolTable);
  if ((!bVar2) && (bVar2 = builtInName(this,this->blockName), bVar2)) {
    redeclareBuiltinBlock(this,loc,typeList,this->blockName,instanceName,arraySizes);
    return;
  }
  reservedErrorCheck(this,loc,this->blockName);
  if (instanceName != (TString *)0x0) {
    reservedErrorCheck(this,loc,instanceName);
  }
  for (defaultQualification._76_4_ = 0; uVar11 = (ulong)(uint)defaultQualification._76_4_,
      sVar6 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::size
                        (&typeList->
                          super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                        ), uVar11 < sVar6;
      defaultQualification._76_4_ = defaultQualification._76_4_ + 1) {
    pvVar7 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::operator[]
                       (&typeList->
                         super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                        ,(ulong)(uint)defaultQualification._76_4_);
    pvVar12 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
              operator[](&typeList->
                          super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                         ,(ulong)(uint)defaultQualification._76_4_);
    iVar4 = (*pvVar12->type->_vptr_TType[6])();
    reservedErrorCheck(this,&pvVar7->loc,(TString *)CONCAT44(extraout_var_08,iVar4));
  }
  switch(*(uint *)&(this->currentBlockQualifier).field_0x8 & 0x7f) {
  case 3:
    memcpy(&member_2,&this->globalInputDefaults,0x50);
    break;
  case 4:
    memcpy(&member_2,&this->globalOutputDefaults,0x50);
    break;
  case 5:
    memcpy(&member_2,&this->globalUniformDefaults,0x50);
    break;
  case 6:
    memcpy(&member_2,&this->globalBufferDefaults,0x50);
    break;
  case 7:
    memcpy(&member_2,&this->globalSharedDefaults,0x50);
    break;
  default:
    TQualifier::clear((TQualifier *)&member_2);
  }
  bVar2 = TQualifier::isPushConstant(&this->currentBlockQualifier);
  if (((bVar2) && (bVar2 = TQualifier::hasPacking(&this->currentBlockQualifier), !bVar2)) ||
     ((bVar2 = TQualifier::isShaderRecord(&this->currentBlockQualifier), bVar2 &&
      (bVar2 = TQualifier::hasPacking(&this->currentBlockQualifier), !bVar2)))) {
    (this->currentBlockQualifier).field_0x10 = (this->currentBlockQualifier).field_0x10 & 0xf0 | 3;
  }
  bVar2 = TQualifier::isTaskMemory(&this->currentBlockQualifier);
  if ((bVar2) && (bVar2 = TQualifier::hasPacking(&this->currentBlockQualifier), !bVar2)) {
    (this->currentBlockQualifier).field_0x10 = (this->currentBlockQualifier).field_0x10 & 0xf0 | 3;
  }
  mergeObjectLayoutQualifiers(this,(TQualifier *)&member_2,&this->currentBlockQualifier,true);
  bVar2 = TQualifier::hasAlign(&this->currentBlockQualifier);
  if ((((bVar2) && ((defaultQualification._8_1_ & 0xf) != 2)) &&
      ((defaultQualification._8_1_ & 0xf) != 3)) && ((defaultQualification._8_1_ & 0xf) != 5)) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"can only be used with std140, std430, or scalar layout packing","align");
    defaultQualification._16_4_ = 0xffffffff;
  }
  memberQualifier_1._7_1_ = false;
  memberQualifier_1._6_1_ = false;
  bVar2 = false;
  for (memberQualifier_1._0_4_ = 0;
      sVar6 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::size
                        (&typeList->
                          super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                        ), (uint)memberQualifier_1 < sVar6;
      memberQualifier_1._0_4_ = (uint)memberQualifier_1 + 1) {
    pvVar7 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::operator[]
                       (&typeList->
                         super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                        ,(ulong)(uint)memberQualifier_1);
    iVar4 = (*pvVar7->type->_vptr_TType[10])();
    pTVar16 = (TQualifier *)CONCAT44(extraout_var_09,iVar4);
    pvVar7 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::operator[]
                       (&typeList->
                         super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                        ,(ulong)(uint)memberQualifier_1);
    pTVar8 = &pvVar7->loc;
    bVar3 = TQualifier::hasStream(pTVar16);
    if ((bVar3) &&
       (defaultQualification.layoutAlign._3_1_ !=
        (char)((ulong)*(undefined8 *)&pTVar16->field_0x1c >> 0x38))) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,pTVar8,"member cannot contradict block","stream");
    }
    bVar3 = TQualifier::hasXfbBuffer(pTVar16);
    if ((bVar3) &&
       ((defaultQualification._28_4_ & 0xf) != ((uint)*(undefined8 *)&pTVar16->field_0x24 & 0xf))) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,pTVar8,"member cannot contradict block (or what block inherited from global)",
                 "xfb_buffer");
    }
    bVar3 = TQualifier::hasPacking(pTVar16);
    if (bVar3) {
      pvVar7 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
               operator[](&typeList->
                           super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                          ,(ulong)(uint)memberQualifier_1);
      iVar4 = (*pvVar7->type->_vptr_TType[6])();
      pcVar9 = std::__cxx11::
               basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                         ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                           *)CONCAT44(extraout_var_10,iVar4));
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,pTVar8,"member of block cannot have a packing layout qualifier",pcVar9);
    }
    bVar3 = TQualifier::hasLocation(pTVar16);
    if (bVar3) {
      newMemberQualification._72_8_ = anon_var_dwarf_ca5391;
      uVar5 = *(uint *)&(this->currentBlockQualifier).field_0x8 & 0x7f;
      if (uVar5 == 3 || uVar5 == 4) {
        TParseVersions::requireProfile((TParseVersions *)this,pTVar8,0xe,"location on block member")
        ;
        TParseVersions::profileRequires
                  ((TParseVersions *)this,pTVar8,6,0x1b8,"GL_ARB_enhanced_layouts",
                   (char *)newMemberQualification._72_8_);
        TParseVersions::profileRequires
                  ((TParseVersions *)this,pTVar8,8,0x140,2,(char **)AEP_shader_io_blocks,
                   (char *)newMemberQualification._72_8_);
        memberQualifier_1._7_1_ = true;
      }
      else {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,pTVar8,"can only use in an in/out block","location on block member");
      }
    }
    else {
      memberQualifier_1._6_1_ = true;
    }
    bVar3 = TQualifier::hasAlign(pTVar16);
    if ((((bVar3) || (bVar3 = TQualifier::hasOffset(pTVar16), bVar3)) &&
        ((defaultQualification._8_1_ & 0xf) != 2)) &&
       (((defaultQualification._8_1_ & 0xf) != 3 && ((defaultQualification._8_1_ & 0xf) != 5)))) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,pTVar8,"can only be used with std140, std430, or scalar layout packing",
                 "offset/align");
    }
    bVar3 = TQualifier::isPerView(pTVar16);
    if (bVar3) {
      bVar2 = true;
    }
    memcpy(&member_4,&member_2,0x50);
    mergeQualifiers(this,pTVar8,(TQualifier *)&member_4,pTVar16,false);
    memcpy(pTVar16,&member_4,0x50);
  }
  layoutMemberLocationArrayCheck(this,loc,memberQualifier_1._7_1_,arraySizes);
  if (((((uint)*(undefined8 *)&(this->currentBlockQualifier).field_0x8 & 0x7f) == 4) &&
      (bVar3 = TQualifier::hasXfbBuffer(&this->globalOutputDefaults), bVar3)) &&
     ((bVar3 = TQualifier::hasXfbBuffer(&this->currentBlockQualifier), !bVar3 &&
      (bVar3 = TQualifier::hasXfbOffset(&this->currentBlockQualifier), bVar3)))) {
    *(ulong *)&(this->currentBlockQualifier).field_0x24 =
         *(ulong *)&(this->currentBlockQualifier).field_0x24 & 0xfffffffffffffff0 |
         (ulong)((uint)*(undefined8 *)&(this->globalOutputDefaults).field_0x24 & 0xf);
  }
  fixBlockLocations(this,loc,&this->currentBlockQualifier,typeList,memberQualifier_1._7_1_,
                    memberQualifier_1._6_1_);
  fixXfbOffsets(this,&this->currentBlockQualifier,typeList);
  fixBlockUniformOffsets(this,&this->currentBlockQualifier,typeList);
  fixBlockUniformLayoutMatrix(this,&this->currentBlockQualifier,typeList,(TTypeList *)0x0);
  fixBlockUniformLayoutPacking(this,&this->currentBlockQualifier,typeList,(TTypeList *)0x0);
  for (blockType.spirvType._4_4_ = 0;
      sVar6 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::size
                        (&typeList->
                          super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                        ), blockType.spirvType._4_4_ < sVar6;
      blockType.spirvType._4_4_ = blockType.spirvType._4_4_ + 1) {
    pvVar7 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::operator[]
                       (&typeList->
                         super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                        ,(ulong)blockType.spirvType._4_4_);
    pvVar12 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
              operator[](&typeList->
                          super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                         ,(ulong)blockType.spirvType._4_4_);
    layoutTypeCheck(this,&pvVar7->loc,pvVar12->type);
  }
  if (bVar2) {
    for (blockType.spirvType._0_4_ = 0;
        sVar6 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::size
                          (&typeList->
                            super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                          ), (uint)blockType.spirvType < sVar6;
        blockType.spirvType._0_4_ = (uint)blockType.spirvType + 1) {
      pvVar7 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
               operator[](&typeList->
                           super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                          ,(ulong)(uint)blockType.spirvType);
      pvVar12 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
                operator[](&typeList->
                            super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                           ,(ulong)(uint)blockType.spirvType);
      checkAndResizeMeshViewDim(this,&pvVar7->loc,pvVar12->type,true);
    }
  }
  mergeObjectLayoutQualifiers(this,&this->currentBlockQualifier,(TQualifier *)&member_2,true);
  TType::TType((TType *)&blockNameType.spirvType,typeList,this->blockName,
               &this->currentBlockQualifier);
  if (arraySizes == (TArraySizes *)0x0) {
    local_3e0 = instanceName;
    if (instanceName == (TString *)0x0) {
      local_3e0 = this->blockName;
    }
    ioArrayCheck(this,loc,(TType *)&blockNameType.spirvType,local_3e0);
  }
  else {
    TType::transferArraySizes((TType *)&blockNameType.spirvType,arraySizes);
  }
  bVar2 = TQualifier::hasBufferReference(&this->currentBlockQualifier);
  if (bVar2) {
    if (((uint)*(undefined8 *)&(this->currentBlockQualifier).field_0x8 & 0x7f) != 6) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"can only be used with buffer","buffer_reference","");
    }
    sVar20 = 0x12;
    TType::TType((TType *)&blockNameVar,EbtReference,(TType *)&blockNameType.spirvType,
                 this->blockName);
    pTVar17 = (TVariable *)TSymbol::operator_new((TSymbol *)0xf8,sVar20);
    TVariable::TVariable(pTVar17,this->blockName,(TType *)&blockNameVar,true);
    bVar2 = TSymbolTable::insert((this->super_TParseContextBase).symbolTable,(TSymbol *)pTVar17);
    if (!bVar2) {
      pTVar13 = TSymbolTable::find((this->super_TParseContextBase).symbolTable,this->blockName,
                                   (bool *)0x0,(bool *)0x0,(int *)0x0);
      iVar4 = (*pTVar13->_vptr_TSymbol[0xc])();
      bVar2 = TType::isReference((TType *)CONCAT44(extraout_var_11,iVar4));
      if (bVar2) {
        iVar4 = (*pTVar13->_vptr_TSymbol[0xc])();
        pTVar14 = (TType *)(**(code **)(*(long *)CONCAT44(extraout_var_12,iVar4) + 0xa8))();
        pTVar15 = TType::getStruct(pTVar14);
        if (pTVar15 != (TTypeList *)0x0) {
          iVar4 = (*pTVar13->_vptr_TSymbol[0xc])();
          pTVar14 = (TType *)(**(code **)(*(long *)CONCAT44(extraout_var_13,iVar4) + 0xa8))();
          this_00 = &TType::getStruct(pTVar14)->
                     super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>;
          sVar6 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::size
                            (this_00);
          if (sVar6 == 0) {
            iVar4 = (*pTVar13->_vptr_TSymbol[0xc])();
            lVar18 = (**(code **)(*(long *)CONCAT44(extraout_var_14,iVar4) + 0x58))();
            uVar1 = *(undefined8 *)(lVar18 + 8);
            pTVar16 = TType::getQualifier((TType *)&blockNameType.spirvType);
            if (((uint)uVar1 & 0x7f) == ((uint)*(undefined8 *)&pTVar16->field_0x8 & 0x7f)) {
              iVar4 = (*pTVar13->_vptr_TSymbol[0xc])();
              pTVar14 = (TType *)(**(code **)(*(long *)CONCAT44(extraout_var_15,iVar4) + 0xa8))();
              pTVar17 = (TVariable *)&blockNameType.spirvType;
              TType::deepCopy(pTVar14,(TType *)pTVar17);
              goto LAB_00777613;
            }
          }
        }
      }
      pcVar9 = std::__cxx11::
               basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                         (this->blockName);
      pTVar17 = (TVariable *)loc;
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"block name cannot be redefined",pcVar9,"");
    }
LAB_00777613:
    blockNameType_1.spirvType._5_3_ = 0;
    blockNameType_1.spirvType._4_1_ = instanceName == (TString *)0x0;
    TType::~TType((TType *)&blockNameVar);
    goto joined_r0x00777644;
  }
  pTVar16 = TType::getQualifier((TType *)&blockNameType.spirvType);
  sVar20 = 0x10;
  TType::TType((TType *)&blockNameVar_1,EbtBlock,
               (TStorageQualifier)*(undefined8 *)&pTVar16->field_0x8 & 0x7f,1,0,0,false);
  pTVar17 = (TVariable *)TSymbol::operator_new((TSymbol *)0xf8,sVar20);
  TVariable::TVariable(pTVar17,this->blockName,(TType *)&blockNameVar_1,false);
  existingName_1 = (TSymbol *)pTVar17;
  bVar2 = TSymbolTable::insert((this->super_TParseContextBase).symbolTable,(TSymbol *)pTVar17);
  if (bVar2) {
LAB_0077783b:
    blockNameType_1.spirvType._4_4_ = 0;
  }
  else {
    pTVar17 = (TVariable *)this->blockName;
    variable = (TVariable *)
               TSymbolTable::find((this->super_TParseContextBase).symbolTable,(TString *)pTVar17,
                                  (bool *)0x0,(bool *)0x0,(int *)0x0);
    iVar4 = (*(variable->super_TSymbol)._vptr_TSymbol[0xc])();
    iVar4 = (**(code **)(*(long *)CONCAT44(extraout_var_16,iVar4) + 0x38))();
    if (iVar4 == 0x10) {
      iVar4 = (*(variable->super_TSymbol)._vptr_TSymbol[0xc])();
      lVar18 = (**(code **)(*(long *)CONCAT44(extraout_var_17,iVar4) + 0x58))();
      uVar1 = *(undefined8 *)(lVar18 + 8);
      pTVar16 = TType::getQualifier((TType *)&blockNameType.spirvType);
      if (((uint)uVar1 & 0x7f) != ((uint)*(undefined8 *)&pTVar16->field_0x8 & 0x7f))
      goto LAB_0077783b;
      pcVar9 = std::__cxx11::
               basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                         (this->blockName);
      pcVar19 = TType::getStorageQualifierString((TType *)&blockNameType.spirvType);
      pTVar17 = (TVariable *)loc;
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"Cannot reuse block name within the same interface:",pcVar9,pcVar19);
      blockNameType_1.spirvType._4_4_ = 1;
    }
    else {
      pcVar9 = std::__cxx11::
               basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                         (this->blockName);
      pTVar17 = (TVariable *)loc;
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"block name cannot redefine a non-block name",pcVar9,"");
      blockNameType_1.spirvType._4_4_ = 1;
    }
  }
  TType::~TType((TType *)&blockNameVar_1);
joined_r0x00777644:
  if (blockNameType_1.spirvType._4_4_ == 0) {
    arraySizes_local = (TArraySizes *)instanceName;
    if (instanceName == (TString *)0x0) {
      arraySizes_local = (TArraySizes *)NewPoolTString_abi_cxx11_("");
    }
    pTVar17 = (TVariable *)TSymbol::operator_new((TSymbol *)0xf8,(size_t)pTVar17);
    TVariable::TVariable
              (pTVar17,(TString *)arraySizes_local,(TType *)&blockNameType.spirvType,false);
    local_318 = pTVar17;
    bVar2 = TSymbolTable::insert((this->super_TParseContextBase).symbolTable,(TSymbol *)pTVar17);
    if (bVar2) {
      layoutObjectCheck(this,loc,&local_318->super_TSymbol);
      bVar2 = isIoResizeArray(this,(TType *)&blockNameType.spirvType);
      if (bVar2) {
        local_320 = local_318;
        std::vector<glslang::TSymbol_*,_glslang::pool_allocator<glslang::TSymbol_*>_>::push_back
                  (&(this->ioArraySymbolResizeList).
                    super_vector<glslang::TSymbol_*,_glslang::pool_allocator<glslang::TSymbol_*>_>,
                   (value_type *)&local_320);
        checkIoArraysConsistency(this,loc,true);
      }
      else {
        iVar4 = (*(local_318->super_TSymbol)._vptr_TSymbol[0xd])();
        fixIoArraySize(this,loc,(TType *)CONCAT44(extraout_var_19,iVar4));
      }
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x4d])
                (this,local_318);
      blockNameType_1.spirvType._4_4_ = 0;
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                               *)arraySizes_local,"");
      if (bVar2) {
        pcVar9 = std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                           (this->blockName);
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,
                   "nameless block contains a member that already has a name at global scope",pcVar9
                   ,"");
      }
      else {
        iVar4 = (*(local_318->super_TSymbol)._vptr_TSymbol[3])();
        pcVar9 = std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                           ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                             *)CONCAT44(extraout_var_18,iVar4));
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"block instance name redefinition",pcVar9,"");
      }
      blockNameType_1.spirvType._4_4_ = 1;
    }
  }
  TType::~TType((TType *)&blockNameType.spirvType);
  return;
}

Assistant:

void TParseContext::declareBlock(const TSourceLoc& loc, TTypeList& typeList, const TString* instanceName,
    TArraySizes* arraySizes)
{
    if (spvVersion.vulkan > 0 && spvVersion.vulkanRelaxed)
        blockStorageRemap(loc, blockName, currentBlockQualifier);
    blockStageIoCheck(loc, currentBlockQualifier);
    blockQualifierCheck(loc, currentBlockQualifier, instanceName != nullptr);
    if (arraySizes != nullptr) {
        arraySizesCheck(loc, currentBlockQualifier, arraySizes, nullptr, false);
        arrayOfArrayVersionCheck(loc, arraySizes);
        if (arraySizes->getNumDims() > 1)
            requireProfile(loc, ~EEsProfile, "array-of-array of block");
    }

    // Inherit and check member storage qualifiers WRT to the block-level qualifier.
    for (unsigned int member = 0; member < typeList.size(); ++member) {
        TType& memberType = *typeList[member].type;
        TQualifier& memberQualifier = memberType.getQualifier();
        const TSourceLoc& memberLoc = typeList[member].loc;
        if (memberQualifier.storage != EvqTemporary && memberQualifier.storage != EvqGlobal && memberQualifier.storage != currentBlockQualifier.storage)
            error(memberLoc, "member storage qualifier cannot contradict block storage qualifier", memberType.getFieldName().c_str(), "");
        memberQualifier.storage = currentBlockQualifier.storage;
        globalQualifierFixCheck(memberLoc, memberQualifier);
        inheritMemoryQualifiers(currentBlockQualifier, memberQualifier);
        if (currentBlockQualifier.perPrimitiveNV)
            memberQualifier.perPrimitiveNV = currentBlockQualifier.perPrimitiveNV;
        if (currentBlockQualifier.perViewNV)
            memberQualifier.perViewNV = currentBlockQualifier.perViewNV;
        if (currentBlockQualifier.perTaskNV)
            memberQualifier.perTaskNV = currentBlockQualifier.perTaskNV;
        if (currentBlockQualifier.storage == EvqtaskPayloadSharedEXT)
            memberQualifier.storage = EvqtaskPayloadSharedEXT;
        if (memberQualifier.storage == EvqSpirvStorageClass)
            error(memberLoc, "member cannot have a spirv_storage_class qualifier", memberType.getFieldName().c_str(), "");
        if (memberQualifier.hasSpirvDecorate() && !memberQualifier.getSpirvDecorate().decorateIds.empty())
            error(memberLoc, "member cannot have a spirv_decorate_id qualifier", memberType.getFieldName().c_str(), "");
        if ((currentBlockQualifier.storage == EvqUniform || currentBlockQualifier.storage == EvqBuffer) && (memberQualifier.isInterpolation() || memberQualifier.isAuxiliary()))
            error(memberLoc, "member of uniform or buffer block cannot have an auxiliary or interpolation qualifier", memberType.getFieldName().c_str(), "");
        if (memberType.isArray())
            arraySizesCheck(memberLoc, currentBlockQualifier, memberType.getArraySizes(), nullptr, member == typeList.size() - 1);
        if (memberQualifier.hasOffset()) {
            if (spvVersion.spv == 0) {
                profileRequires(memberLoc, ~EEsProfile, 440, E_GL_ARB_enhanced_layouts, "\"offset\" on block member");
                profileRequires(memberLoc, EEsProfile, 300, E_GL_ARB_enhanced_layouts, "\"offset\" on block member");
            }
        }

        // For bindless texture, sampler can be declared as uniform/storage block member,
        if (memberType.containsOpaque()) {
            if (memberType.containsSampler() && extensionTurnedOn(E_GL_ARB_bindless_texture))
                updateBindlessQualifier(memberType);
            else
                error(memberLoc, "member of block cannot be or contain a sampler, image, or atomic_uint type", typeList[member].type->getFieldName().c_str(), "");
            }

        if (memberType.containsCoopMat())
            error(memberLoc, "member of block cannot be or contain a cooperative matrix type", typeList[member].type->getFieldName().c_str(), "");

        if (memberType.containsCoopVec())
            error(memberLoc, "member of block cannot be or contain a cooperative vector type", typeList[member].type->getFieldName().c_str(), "");
    }

    // This might be a redeclaration of a built-in block.  If so, redeclareBuiltinBlock() will
    // do all the rest.
    if (! symbolTable.atBuiltInLevel() && builtInName(*blockName)) {
        redeclareBuiltinBlock(loc, typeList, *blockName, instanceName, arraySizes);
        return;
    }

    // Not a redeclaration of a built-in; check that all names are user names.
    reservedErrorCheck(loc, *blockName);
    if (instanceName)
        reservedErrorCheck(loc, *instanceName);
    for (unsigned int member = 0; member < typeList.size(); ++member)
        reservedErrorCheck(typeList[member].loc, typeList[member].type->getFieldName());

    // Make default block qualification, and adjust the member qualifications

    TQualifier defaultQualification;
    switch (currentBlockQualifier.storage) {
    case EvqUniform:    defaultQualification = globalUniformDefaults;    break;
    case EvqBuffer:     defaultQualification = globalBufferDefaults;     break;
    case EvqVaryingIn:  defaultQualification = globalInputDefaults;      break;
    case EvqVaryingOut: defaultQualification = globalOutputDefaults;     break;
    case EvqShared:     defaultQualification = globalSharedDefaults;     break;
    default:            defaultQualification.clear();                    break;
    }

    // Special case for "push_constant uniform", which has a default of std430,
    // contrary to normal uniform defaults, and can't have a default tracked for it.
    if ((currentBlockQualifier.isPushConstant() && !currentBlockQualifier.hasPacking()) ||
        (currentBlockQualifier.isShaderRecord() && !currentBlockQualifier.hasPacking()))
        currentBlockQualifier.layoutPacking = ElpStd430;

    // Special case for "taskNV in/out", which has a default of std430,
    if (currentBlockQualifier.isTaskMemory() && !currentBlockQualifier.hasPacking())
        currentBlockQualifier.layoutPacking = ElpStd430;

    // fix and check for member layout qualifiers

    mergeObjectLayoutQualifiers(defaultQualification, currentBlockQualifier, true);

    // "The align qualifier can only be used on blocks or block members, and only for blocks declared with std140 or std430 layouts."
    if (currentBlockQualifier.hasAlign()) {
        if (defaultQualification.layoutPacking != ElpStd140 &&
            defaultQualification.layoutPacking != ElpStd430 &&
            defaultQualification.layoutPacking != ElpScalar) {
            error(loc, "can only be used with std140, std430, or scalar layout packing", "align", "");
            defaultQualification.layoutAlign = -1;
        }
    }

    bool memberWithLocation = false;
    bool memberWithoutLocation = false;
    bool memberWithPerViewQualifier = false;
    for (unsigned int member = 0; member < typeList.size(); ++member) {
        TQualifier& memberQualifier = typeList[member].type->getQualifier();
        const TSourceLoc& memberLoc = typeList[member].loc;
        if (memberQualifier.hasStream()) {
            if (defaultQualification.layoutStream != memberQualifier.layoutStream)
                error(memberLoc, "member cannot contradict block", "stream", "");
        }

        // "This includes a block's inheritance of the
        // current global default buffer, a block member's inheritance of the block's
        // buffer, and the requirement that any *xfb_buffer* declared on a block
        // member must match the buffer inherited from the block."
        if (memberQualifier.hasXfbBuffer()) {
            if (defaultQualification.layoutXfbBuffer != memberQualifier.layoutXfbBuffer)
                error(memberLoc, "member cannot contradict block (or what block inherited from global)", "xfb_buffer", "");
        }

        if (memberQualifier.hasPacking())
            error(memberLoc, "member of block cannot have a packing layout qualifier", typeList[member].type->getFieldName().c_str(), "");
        if (memberQualifier.hasLocation()) {
            const char* feature = "location on block member";
            switch (currentBlockQualifier.storage) {
            case EvqVaryingIn:
            case EvqVaryingOut:
                requireProfile(memberLoc, ECoreProfile | ECompatibilityProfile | EEsProfile, feature);
                profileRequires(memberLoc, ECoreProfile | ECompatibilityProfile, 440, E_GL_ARB_enhanced_layouts, feature);
                profileRequires(memberLoc, EEsProfile, 320, Num_AEP_shader_io_blocks, AEP_shader_io_blocks, feature);
                memberWithLocation = true;
                break;
            default:
                error(memberLoc, "can only use in an in/out block", feature, "");
                break;
            }
        } else
            memberWithoutLocation = true;

        // "The offset qualifier can only be used on block members of blocks declared with std140 or std430 layouts."
        // "The align qualifier can only be used on blocks or block members, and only for blocks declared with std140 or std430 layouts."
        if (memberQualifier.hasAlign() || memberQualifier.hasOffset()) {
            if (defaultQualification.layoutPacking != ElpStd140 &&
                defaultQualification.layoutPacking != ElpStd430 &&
                defaultQualification.layoutPacking != ElpScalar)
                error(memberLoc, "can only be used with std140, std430, or scalar layout packing", "offset/align", "");
        }

        if (memberQualifier.isPerView()) {
            memberWithPerViewQualifier = true;
        }

        TQualifier newMemberQualification = defaultQualification;
        mergeQualifiers(memberLoc, newMemberQualification, memberQualifier, false);
        memberQualifier = newMemberQualification;
    }

    layoutMemberLocationArrayCheck(loc, memberWithLocation, arraySizes);

    // Ensure that the block has an XfbBuffer assigned. This is needed
    // because if the block has a XfbOffset assigned, then it is
    // assumed that it has implicitly assigned the current global
    // XfbBuffer, and because it's members need to be assigned a
    // XfbOffset if they lack it.
    if (currentBlockQualifier.storage == EvqVaryingOut && globalOutputDefaults.hasXfbBuffer()) {
       if (!currentBlockQualifier.hasXfbBuffer() && currentBlockQualifier.hasXfbOffset())
          currentBlockQualifier.layoutXfbBuffer = globalOutputDefaults.layoutXfbBuffer;
    }

    // Process the members
    fixBlockLocations(loc, currentBlockQualifier, typeList, memberWithLocation, memberWithoutLocation);
    fixXfbOffsets(currentBlockQualifier, typeList);
    fixBlockUniformOffsets(currentBlockQualifier, typeList);
    fixBlockUniformLayoutMatrix(currentBlockQualifier, &typeList, nullptr);
    fixBlockUniformLayoutPacking(currentBlockQualifier, &typeList, nullptr);
    for (unsigned int member = 0; member < typeList.size(); ++member)
        layoutTypeCheck(typeList[member].loc, *typeList[member].type);

    if (memberWithPerViewQualifier) {
        for (unsigned int member = 0; member < typeList.size(); ++member) {
            checkAndResizeMeshViewDim(typeList[member].loc, *typeList[member].type, /*isBlockMember*/ true);
        }
    }

    // reverse merge, so that currentBlockQualifier now has all layout information
    // (can't use defaultQualification directly, it's missing other non-layout-default-class qualifiers)
    mergeObjectLayoutQualifiers(currentBlockQualifier, defaultQualification, true);

    //
    // Build and add the interface block as a new type named 'blockName'
    //

    TType blockType(&typeList, *blockName, currentBlockQualifier);
    if (arraySizes != nullptr)
        blockType.transferArraySizes(arraySizes);

    if (arraySizes == nullptr)
        ioArrayCheck(loc, blockType, instanceName ? *instanceName : *blockName);
    if (currentBlockQualifier.hasBufferReference()) {

        if (currentBlockQualifier.storage != EvqBuffer)
            error(loc, "can only be used with buffer", "buffer_reference", "");

        // Create the block reference type. If it was forward-declared, detect that
        // as a referent struct type with no members. Replace the referent type with
        // blockType.
        TType blockNameType(EbtReference, blockType, *blockName);
        TVariable* blockNameVar = new TVariable(blockName, blockNameType, true);
        if (! symbolTable.insert(*blockNameVar)) {
            TSymbol* existingName = symbolTable.find(*blockName);
            if (existingName->getType().isReference() &&
                existingName->getType().getReferentType()->getStruct() &&
                existingName->getType().getReferentType()->getStruct()->size() == 0 &&
                existingName->getType().getQualifier().storage == blockType.getQualifier().storage) {
                existingName->getType().getReferentType()->deepCopy(blockType);
            } else {
                error(loc, "block name cannot be redefined", blockName->c_str(), "");
            }
        }
        if (!instanceName) {
            return;
        }
    } else {
        //
        // Don't make a user-defined type out of block name; that will cause an error
        // if the same block name gets reused in a different interface.
        //
        // "Block names have no other use within a shader
        // beyond interface matching; it is a compile-time error to use a block name at global scope for anything
        // other than as a block name (e.g., use of a block name for a global variable name or function name is
        // currently reserved)."
        //
        // Use the symbol table to prevent normal reuse of the block's name, as a variable entry,
        // whose type is EbtBlock, but without all the structure; that will come from the type
        // the instances point to.
        //
        TType blockNameType(EbtBlock, blockType.getQualifier().storage);
        TVariable* blockNameVar = new TVariable(blockName, blockNameType);
        if (! symbolTable.insert(*blockNameVar)) {
            TSymbol* existingName = symbolTable.find(*blockName);
            if (existingName->getType().getBasicType() == EbtBlock) {
                if (existingName->getType().getQualifier().storage == blockType.getQualifier().storage) {
                    error(loc, "Cannot reuse block name within the same interface:", blockName->c_str(), blockType.getStorageQualifierString());
                    return;
                }
            } else {
                error(loc, "block name cannot redefine a non-block name", blockName->c_str(), "");
                return;
            }
        }
    }

    // Add the variable, as anonymous or named instanceName.
    // Make an anonymous variable if no name was provided.
    if (! instanceName)
        instanceName = NewPoolTString("");

    TVariable& variable = *new TVariable(instanceName, blockType);
    if (! symbolTable.insert(variable)) {
        if (*instanceName == "")
            error(loc, "nameless block contains a member that already has a name at global scope", blockName->c_str(), "");
        else
            error(loc, "block instance name redefinition", variable.getName().c_str(), "");

        return;
    }

    // Check for general layout qualifier errors
    layoutObjectCheck(loc, variable);

    // fix up
    if (isIoResizeArray(blockType)) {
        ioArraySymbolResizeList.push_back(&variable);
        checkIoArraysConsistency(loc, true);
    } else
        fixIoArraySize(loc, variable.getWritableType());

    // Save it in the AST for linker use.
    trackLinkage(variable);
}